

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
::LookupBucketFor<unsigned_long>
          (DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
           *this,unsigned_long *Val,
          DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> **FoundBucket)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *pDVar9;
  int iVar10;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *pDVar11;
  
  if (*(int *)(this + 0x10) == 0) {
    *FoundBucket = (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0;
    bVar5 = 0;
  }
  else {
    uVar1 = *Val;
    if (0xfffffffffffffffd < uVar1) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, unsigned long, const llvm::DWARFDebugNames::NameIndex *, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, KeyT = unsigned long, ValueT = const llvm::DWARFDebugNames::NameIndex *, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, LookupKeyT = unsigned long]"
                   );
    }
    lVar2 = *(long *)this;
    iVar6 = (int)uVar1 * 9;
    uVar7 = *(int *)(this + 0x10) - 1;
    uVar8 = (int)uVar1 * 0x25 & uVar7;
    iVar10 = 1;
    pDVar9 = (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0;
    do {
      pDVar11 = (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)
                (lVar2 + (ulong)uVar8 * 0x10);
      uVar3 = *(ulong *)(lVar2 + (ulong)uVar8 * 0x10);
      if (uVar1 == uVar3) {
        *FoundBucket = pDVar11;
        iVar6 = 1;
        bVar4 = false;
      }
      else if (uVar3 == 0xffffffffffffffff) {
        if (pDVar9 != (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0)
        {
          pDVar11 = pDVar9;
        }
        *FoundBucket = pDVar11;
        bVar4 = false;
        iVar6 = 0;
      }
      else {
        if (uVar3 == 0xfffffffffffffffe &&
            pDVar9 == (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0)
        {
          pDVar9 = pDVar11;
        }
        uVar8 = uVar8 + iVar10;
        iVar10 = iVar10 + 1;
        uVar8 = uVar8 & uVar7;
        bVar4 = true;
      }
      bVar5 = (byte)iVar6;
    } while (bVar4);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }